

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O1

bool __thiscall
glcts::anon_unknown_0::AtomicMachine::Atomic<int>
          (AtomicMachine *this,int target,int stage,GLenum internalformat)

{
  CallLogWrapper *this_00;
  int iVar1;
  void *__s;
  int *piVar2;
  Vector<int,_4> *extraout_RDX;
  Vector<int,_4> *extraout_RDX_00;
  Vector<int,_4> *extraout_RDX_01;
  Vector<int,_4> *v;
  bool bVar3;
  GLenum GVar4;
  undefined4 in_register_00000034;
  GLenum in_R8D;
  GLsizei height;
  GLenum *pGVar5;
  int i;
  ulong uVar6;
  GLuint local_94;
  string local_90;
  int local_6c;
  GLuint textures [4];
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (stage == 0) {
    GenShader<int>(&local_90,(AtomicMachine *)CONCAT44(in_register_00000034,target),0,internalformat
                   ,in_R8D);
    local_94 = ShaderImageLoadStoreBase::BuildProgram
                         (&this->super_ShaderImageLoadStoreBase,local_90._M_dataplus._M_p,
                          "\nvoid main() {\n  discard;\n}",true,false);
  }
  else {
    local_94 = 0;
    if (stage != 4) goto LAB_00c6d476;
    GenShader<int>(&local_90,(AtomicMachine *)CONCAT44(in_register_00000034,target),4,internalformat
                   ,in_R8D);
    local_94 = ShaderImageLoadStoreBase::CreateComputeProgram
                         (&this->super_ShaderImageLoadStoreBase,&local_90,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
LAB_00c6d476:
  this_00 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  local_6c = stage;
  glu::CallLogWrapper::glGenTextures(this_00,4,textures);
  pGVar5 = &DAT_01b453f0;
  uVar6 = 0;
  do {
    GVar4 = *pGVar5;
    glu::CallLogWrapper::glBindTexture(this_00,GVar4,textures[uVar6]);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,GVar4,0x2800,0x2600);
    switch(uVar6 & 0xffffffff) {
    case 0:
      GVar4 = 0xde1;
      height = 1;
      goto LAB_00c6d559;
    case 1:
    case 3:
      glu::CallLogWrapper::glTexStorage3D(this_00,GVar4,1,0x8235,100,1,2);
      break;
    case 2:
      GVar4 = 0x8513;
      height = 100;
LAB_00c6d559:
      glu::CallLogWrapper::glTexStorage2D(this_00,GVar4,1,0x8235,100,height);
    }
    uVar6 = uVar6 + 1;
    pGVar5 = pGVar5 + 1;
    if (uVar6 == 4) {
      glu::CallLogWrapper::glBindImageTexture(this_00,1,textures[0],0,'\0',0,0x88ba,0x8235);
      glu::CallLogWrapper::glBindImageTexture(this_00,2,textures[1],0,'\x01',0,0x88ba,0x8235);
      glu::CallLogWrapper::glBindImageTexture(this_00,0,textures[2],0,'\x01',0,0x88ba,0x8235);
      glu::CallLogWrapper::glBindImageTexture(this_00,3,textures[3],0,'\x01',0,0x88ba,0x8235);
      __s = operator_new(0x640);
      memset(__s,0,0x640);
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
      iVar1 = local_6c;
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x640,__s,0x88e4);
      glu::CallLogWrapper::glUseProgram(this_00,local_94);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
      if (iVar1 == 0) {
        glu::CallLogWrapper::glDrawArrays(this_00,0,0,100);
      }
      else if (iVar1 == 4) {
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      }
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      piVar2 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x640,1);
      bVar3 = true;
      uVar6 = 0;
      v = extraout_RDX;
      do {
        if ((((*piVar2 != 0) || (piVar2[1] != 1)) || (piVar2[2] != 0)) || (piVar2[3] != 1)) {
          local_48 = *(undefined8 *)piVar2;
          uStack_40 = *(undefined8 *)(piVar2 + 2);
          glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::ToString<tcu::Vector<int,4>>
                    (&local_90,(ShaderImageLoadStoreBase *)&local_48,v);
          anon_unknown_0::Output
                    ("[%d] Atomic operation check failed. (%s) \n",uVar6 & 0xffffffff,
                     local_90._M_dataplus._M_p);
          v = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
            v = extraout_RDX_01;
          }
          bVar3 = false;
        }
        uVar6 = uVar6 + 1;
        piVar2 = piVar2 + 4;
      } while (uVar6 != 100);
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      glu::CallLogWrapper::glUseProgram(this_00,0);
      glu::CallLogWrapper::glDeleteProgram(this_00,local_94);
      glu::CallLogWrapper::glDeleteTextures(this_00,4,textures);
      operator_delete(__s,0x640);
      return bVar3;
    }
  } while( true );
}

Assistant:

bool Atomic(int target, int stage, GLenum internalformat)
	{
		GLuint program = 0;
		if (stage == 0)
		{ // VS
			const char* src_fs = NL "void main() {" NL "  discard;" NL "}";
			program			   = BuildProgram(GenShader<T>(target, stage, internalformat).c_str(), src_fs, true, false);
		}
		else if (stage == 4)
		{ // CS
			program = CreateComputeProgram(GenShader<T>(target, stage, internalformat), true);
		}

		const GLenum targets[] = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		const int	kTargets  = sizeof(targets) / sizeof(targets[0]);
		const int	kSize	 = 100;

		GLuint textures[kTargets];
		glGenTextures(kTargets, textures);

		for (int i = 0; i < kTargets; ++i)
		{
			glBindTexture(targets[i], textures[i]);
			glTexParameteri(targets[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(targets[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			if (targets[i] == GL_TEXTURE_2D)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, 1);
			}
			else if (targets[i] == GL_TEXTURE_3D || targets[i] == GL_TEXTURE_2D_ARRAY)
			{
				glTexStorage3D(targets[i], 1, internalformat, kSize, 1, 2);
			}
			else if (targets[i] == GL_TEXTURE_CUBE_MAP)
			{
				glTexStorage2D(targets[i], 1, internalformat, kSize, kSize);
			}
		}
		glBindImageTexture(1, textures[0], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat); // 2D
		glBindImageTexture(2, textures[1], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // 3D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // Cube
		glBindImageTexture(3, textures[3], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);  // 2DArray

		std::vector<ivec4> b_data(kSize);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * 4 * 4, &b_data[0], GL_STATIC_DRAW);

		glUseProgram(program);
		glBindVertexArray(m_vao);
		if (stage == 0)
		{ // VS
			glDrawArrays(GL_POINTS, 0, kSize);
		}
		else if (stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool   status   = true;
		ivec4* out_data = (ivec4*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize; ++i)
		{
			if (!Equal(out_data[i], ivec4(0, 1, 0, 1), 0))
			{
				status = false;
				Output("[%d] Atomic operation check failed. (%s) \n", i, ToString(out_data[i]).c_str());
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(kTargets, textures);
		return status;
	}